

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int writebintable(fitsfile *fptr,int *status)

{
  int iVar1;
  long local_b8;
  long local_b0;
  char *local_a8;
  char *tunit [2];
  char *tform [2];
  char *ttype [2];
  char local_6b [8];
  char extname [11];
  double elapse;
  float cpufrac;
  float elapcpu;
  float size;
  float rate;
  long nrows;
  long firstelem;
  long firstrow;
  long ntodo;
  long nremain;
  int *piStack_18;
  int tfields;
  int *status_local;
  fitsfile *fptr_local;
  
  nremain._4_4_ = 2;
  firstelem = 1;
  nrows = 1;
  builtin_strncpy(local_6b,"Speed_Te",8);
  extname[0] = 's';
  extname[1] = 't';
  extname[2] = '\0';
  tform[1] = "first";
  tunit[1] = "1J";
  tform[0] = "1J";
  local_a8 = " ";
  tunit[0] = " ";
  piStack_18 = status;
  status_local = &fptr->HDUposition;
  iVar1 = ffcrtb(fptr,2,2500000,2,tform + 1,tunit + 1,&local_a8,local_6b,status);
  if (iVar1 != 0) {
    printerror(*piStack_18);
  }
  ffgrsz(status_local,&size,piStack_18);
  if (_size < 20000) {
    local_b0 = _size;
  }
  else {
    local_b0 = 20000;
  }
  _size = local_b0;
  ntodo = 2500000;
  printf("Write %7drow x %dcol bintable %4ld rows/loop:",2500000,(ulong)nremain._4_4_,local_b0);
  marktime(piStack_18);
  for (; ntodo != 0; ntodo = ntodo - firstrow) {
    if (_size < ntodo) {
      local_b8 = _size;
    }
    else {
      local_b8 = ntodo;
    }
    firstrow = local_b8;
    ffpclj(status_local,1,firstelem,nrows,local_b8,sarray,piStack_18);
    ffpclj(status_local,2,firstelem,nrows,firstrow,sarray,piStack_18);
    firstelem = firstrow + firstelem;
  }
  ffflus(status_local,piStack_18);
  gettime((double *)(extname + 3),(float *)((long)&elapse + 4),piStack_18);
  elapse._0_4_ = (float)(((double)elapse._4_4_ / (double)extname._3_8_) * 100.0);
  cpufrac = 20.0;
  elapcpu = (float)(20.0 / (double)extname._3_8_);
  printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4034000000000000,extname._3_8_,
         (double)elapse._0_4_,(double)elapcpu);
  return *piStack_18;
}

Assistant:

int writebintable (fitsfile *fptr, int *status)

    /*********************************************************/
    /* Create a binary table extension containing 3 columns  */
    /*********************************************************/
{
    int tfields = 2;
    long nremain, ntodo, firstrow = 1, firstelem = 1, nrows;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    char extname[] = "Speed_Test";           /* extension name */

    /* define the name, datatype, and physical units for the columns */
    char *ttype[] = { "first", "second" };
    char *tform[] = {"1J",       "1J"   };
    char *tunit[] = { " ",       " "    };

    /* append a new empty binary table onto the FITS file */

    if ( fits_create_tbl( fptr, BINARY_TBL, BROWS, tfields, ttype, tform,
                tunit, extname, status) )
         printerror( *status );

    /* get table row size and optimum number of rows to write per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    nremain = BROWS;

    printf("Write %7drow x %dcol bintable %4ld rows/loop:", BROWS, tfields,
       nrows);
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffpclj(fptr, 1, firstrow, firstelem, ntodo, sarray, status);
      ffpclj(fptr, 2, firstrow, firstelem, ntodo, sarray, status);
      firstrow += ntodo;
      nremain -= ntodo;
    }

    ffflus(fptr, status);  /* flush all buffers to disk */

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = BROWS * 8. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}